

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

string * testing::PrintToString<long_long>(string *__return_storage_ptr__,longlong *value)

{
  long in_FS_OFFSET;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(local_1a8);
  testing_internal::DefaultPrintNonContainerTo<long_long>(value,local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

::std::string PrintToString(const T& value) {
        ::std::stringstream ss;
        internal::UniversalTersePrinter<T>::Print(value, &ss);
        return ss.str();
    }